

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O0

int __thiscall QTemporaryFilePrivate::rename(QTemporaryFilePrivate *this,char *__old,char *__new)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  FileError FVar4;
  uint uVar5;
  QTemporaryFile *this_00;
  pointer pQVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *__new_00;
  long in_FS_OFFSET;
  QTemporaryFileEngine *tef;
  QTemporaryFile *q;
  undefined4 in_stack_ffffffffffffff78;
  FileError in_stack_ffffffffffffff7c;
  QFileDevicePrivate *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  byte local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = q_func(this);
  pQVar6 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::get
                     ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                      in_stack_ffffffffffffff80);
  __new_00 = extraout_RDX;
  if (((pQVar6 == (pointer)0x0) ||
      (bVar2 = QTemporaryFileEngine::isReallyOpen
                         ((QTemporaryFileEngine *)
                          CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)),
      __new_00 = extraout_RDX_00, !bVar2)) ||
     (((ulong)pQVar6[2]._vptr_QAbstractFileEngine & 0x100) == 0)) {
    iVar3 = QFile::rename(&this_00->super_QFile,__old,__new_00);
    local_21 = (byte)iVar3 & 1;
  }
  else {
    QFileDevice::unsetError((QFileDevice *)in_stack_ffffffffffffff80);
    (*(this_00->super_QFile).super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject[0xe])();
    FVar4 = QFileDevice::error((QFileDevice *)in_stack_ffffffffffffff80);
    if (FVar4 == NoError) {
      if (((ulong)__new & 1) == 0) {
        uVar5 = (*pQVar6->_vptr_QAbstractFileEngine[0xc])(pQVar6,__old);
      }
      else {
        uVar5 = (*pQVar6->_vptr_QAbstractFileEngine[0xd])(pQVar6,__old);
      }
      if ((uVar5 & 1) != 0) {
        QFileDevice::unsetError((QFileDevice *)in_stack_ffffffffffffff80);
        QString::operator=((QString *)in_stack_ffffffffffffff80,
                           (QString *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
        ;
        local_21 = 1;
        goto LAB_002f9c40;
      }
      QAbstractFileEngine::errorString
                ((QAbstractFileEngine *)
                 CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
      QFileDevicePrivate::setError
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,(QString *)0x2f9c0f);
      QString::~QString((QString *)0x2f9c1b);
    }
    local_21 = 0;
  }
LAB_002f9c40:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_21);
  }
  __stack_chk_fail();
}

Assistant:

bool QTemporaryFilePrivate::rename(const QString &newName, bool overwrite)
{
    Q_Q(QTemporaryFile);
    auto tef = static_cast<QTemporaryFileEngine *>(fileEngine.get());
    if (!tef || !tef->isReallyOpen() || !tef->filePathWasTemplate)
        return q->QFile::rename(newName);

    q->unsetError();
    q->close();
    if (q->error() == QFile::NoError) {
        if (overwrite ? tef->renameOverwrite(newName) : tef->rename(newName)) {
            q->unsetError();
            // engine was able to handle the new name so we just reset it
            fileName = newName;
            return true;
        }

        setError(QFile::RenameError, tef->errorString());
    }
    return false;
}